

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O2

uint __kmp_wait<unsigned_int>(uint *spinner,uint checker,_func_kmp_uint32_uint_uint *pred,void *obj)

{
  kmp_uint32 kVar1;
  kmp_uint32 kVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  
  puVar4 = (uint *)__kmp_itt_fsync_prepare_ptr__3_0;
  if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
    puVar4 = spinner;
  }
  iVar6 = 0;
  kVar2 = __kmp_yield_init;
  while (kVar1 = (*pred)(*spinner,checker), kVar1 == 0) {
    if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
        (iVar6 < __kmp_itt_prepare_delay)) && (iVar6 = iVar6 + 1, __kmp_itt_prepare_delay <= iVar6))
    {
      (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar4);
    }
    if (__kmp_use_yield - 1U < 2) {
      iVar5 = __kmp_avail_proc;
      if (__kmp_avail_proc == 0) {
        iVar5 = __kmp_xproc;
      }
      if (iVar5 < __kmp_nth) {
        __kmp_yield();
      }
      else if ((__kmp_use_yield == 1) && (kVar2 = kVar2 - 2, kVar2 == 0)) {
        __kmp_yield();
        kVar2 = __kmp_yield_next;
      }
    }
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0 || iVar6 < __kmp_itt_prepare_delay) {
    return (uint)__kmp_itt_fsync_acquired_ptr__3_0;
  }
  uVar3 = (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
  return uVar3;
}

Assistant:

static UT __kmp_wait(volatile UT *spinner, UT checker,
                     kmp_uint32 (*pred)(UT, UT) USE_ITT_BUILD_ARG(void *obj)) {
  // note: we may not belong to a team at this point
  volatile UT *spin = spinner;
  UT check = checker;
  kmp_uint32 spins;
  kmp_uint32 (*f)(UT, UT) = pred;
  UT r;

  KMP_FSYNC_SPIN_INIT(obj, CCAST(UT *, spin));
  KMP_INIT_YIELD(spins);
  // main wait spin loop
  while (!f(r = *spin, check)) {
    KMP_FSYNC_SPIN_PREPARE(obj);
    /* GEH - remove this since it was accidentally introduced when kmp_wait was
       split.
       It causes problems with infinite recursion because of exit lock */
    /* if ( TCR_4(__kmp_global.g.g_done) && __kmp_global.g.g_abort)
        __kmp_abort_thread(); */
    // If oversubscribed, or have waited a bit then yield.
    KMP_YIELD_OVERSUB_ELSE_SPIN(spins);
  }
  KMP_FSYNC_SPIN_ACQUIRED(obj);
  return r;
}